

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

int Dar_LibEval_rec(Dar_LibObj_t *pObj,int Out,int nNodesSaved,int Required,float *pPower)

{
  float fVar1;
  float fVar2;
  Dar_LibDat_t *pDVar3;
  Dar_LibDat_t *pDVar4;
  int iVar5;
  int iVar6;
  Dar_LibObj_t *pDVar7;
  uint uVar8;
  uint uVar9;
  float *local_98;
  float *local_78;
  Dar_LibDat_t *pData1;
  Dar_LibDat_t *pData0;
  float local_40;
  int Area;
  float Power1;
  float Power0;
  Dar_LibDat_t *pData;
  float *pPower_local;
  int local_20;
  int Required_local;
  int nNodesSaved_local;
  int Out_local;
  Dar_LibObj_t *pObj_local;
  
  if (pPower != (float *)0x0) {
    *pPower = 0.0;
  }
  _Power1 = s_DarLib->pDatas + (int)(SUB84(*pObj,4) >> 4);
  if (_Power1->TravId == Out) {
    pObj_local._4_4_ = 0;
  }
  else {
    _Power1->TravId = Out;
    if (((ulong)*pObj >> 0x23 & 1) == 0) {
      pData = (Dar_LibDat_t *)pPower;
      pPower_local._4_4_ = Required;
      Required_local = Out;
      _nNodesSaved_local = pObj;
      if (SUB84(*pObj,4) >> 4 < 4) {
        local_20 = nNodesSaved;
        __assert_fail("pObj->Num > 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darLib.c"
                      ,0x370,"int Dar_LibEval_rec(Dar_LibObj_t *, int, int, int, float *)");
      }
      if (Required < _Power1->Level) {
        pObj_local._4_4_ = 0xff;
      }
      else if (((_Power1->field_0).pFunc == (Aig_Obj_t *)0x0) || (_Power1->fMffc != '\0')) {
        local_20 = nNodesSaved + -1;
        pDVar7 = Dar_LibObj(s_DarLib,SUB84(*pObj,0) & 0xffff);
        if (pData == (Dar_LibDat_t *)0x0) {
          local_78 = (float *)0x0;
        }
        else {
          local_78 = (float *)&Area;
        }
        iVar5 = Dar_LibEval_rec(pDVar7,Required_local,local_20,pPower_local._4_4_ + 1,local_78);
        if (local_20 < iVar5) {
          pObj_local._4_4_ = 0xff;
        }
        else {
          pDVar7 = Dar_LibObj(s_DarLib,SUB84(*_nNodesSaved_local,2) & 0xffff);
          if (pData == (Dar_LibDat_t *)0x0) {
            local_98 = (float *)0x0;
          }
          else {
            local_98 = &local_40;
          }
          iVar6 = Dar_LibEval_rec(pDVar7,Required_local,local_20,pPower_local._4_4_ + 1,local_98);
          if (local_20 < iVar6 + iVar5) {
            pObj_local._4_4_ = 0xff;
          }
          else {
            if (pData != (Dar_LibDat_t *)0x0) {
              pDVar3 = s_DarLib->pDatas;
              pDVar7 = Dar_LibObj(s_DarLib,SUB84(*_nNodesSaved_local,0) & 0xffff);
              uVar8 = SUB84(*pDVar7,4) >> 4;
              pDVar4 = s_DarLib->pDatas;
              pDVar7 = Dar_LibObj(s_DarLib,SUB84(*_nNodesSaved_local,2) & 0xffff);
              uVar9 = SUB84(*pDVar7,4) >> 4;
              if (((ulong)*_nNodesSaved_local >> 0x20 & 1) == 0) {
                fVar1 = pDVar3[(int)uVar8].dProb;
              }
              else {
                fVar1 = 1.0 - pDVar3[(int)uVar8].dProb;
              }
              if (((ulong)*_nNodesSaved_local >> 0x21 & 1) == 0) {
                fVar2 = pDVar4[(int)uVar9].dProb;
              }
              else {
                fVar2 = 1.0 - pDVar4[(int)uVar9].dProb;
              }
              _Power1->dProb = fVar1 * fVar2;
              *(float *)&pData->field_0 =
                   pDVar4[(int)uVar9].dProb * 2.0 * (1.0 - pDVar4[(int)uVar9].dProb) +
                   pDVar3[(int)uVar8].dProb * 2.0 * (1.0 - pDVar3[(int)uVar8].dProb) + (float)Area +
                   local_40;
            }
            pObj_local._4_4_ = iVar6 + iVar5 + 1;
          }
        }
      }
      else {
        if (pPower != (float *)0x0) {
          *pPower = _Power1->dProb;
        }
        pObj_local._4_4_ = 0;
      }
    }
    else {
      if (pPower != (float *)0x0) {
        *pPower = _Power1->dProb;
      }
      pObj_local._4_4_ = 0;
    }
  }
  return pObj_local._4_4_;
}

Assistant:

int Dar_LibEval_rec( Dar_LibObj_t * pObj, int Out, int nNodesSaved, int Required, float * pPower )
{
    Dar_LibDat_t * pData;
    float Power0, Power1;
    int Area;
    if ( pPower )
        *pPower = (float)0.0;
    pData = s_DarLib->pDatas + pObj->Num;
    if ( pData->TravId == Out )
        return 0;
    pData->TravId = Out;
    if ( pObj->fTerm )
    {
        if ( pPower )
            *pPower = pData->dProb;
        return 0;
    }
    assert( pObj->Num > 3 );
    if ( pData->Level > Required )
        return 0xff;
    if ( pData->pFunc && !pData->fMffc )
    {
        if ( pPower )
            *pPower = pData->dProb;
        return 0;
    }
    // this is a new node - get a bound on the area of its branches
    nNodesSaved--;
    Area = Dar_LibEval_rec( Dar_LibObj(s_DarLib, pObj->Fan0), Out, nNodesSaved, Required+1, pPower? &Power0 : NULL );
    if ( Area > nNodesSaved )
        return 0xff;
    Area += Dar_LibEval_rec( Dar_LibObj(s_DarLib, pObj->Fan1), Out, nNodesSaved, Required+1, pPower? &Power1 : NULL );
    if ( Area > nNodesSaved )
        return 0xff;
    if ( pPower )
    {
        Dar_LibDat_t * pData0 = s_DarLib->pDatas + Dar_LibObj(s_DarLib, pObj->Fan0)->Num;
        Dar_LibDat_t * pData1 = s_DarLib->pDatas + Dar_LibObj(s_DarLib, pObj->Fan1)->Num;
        pData->dProb = (pObj->fCompl0? 1.0 - pData0->dProb : pData0->dProb)*
                       (pObj->fCompl1? 1.0 - pData1->dProb : pData1->dProb);
        *pPower = Power0 + 2.0 * pData0->dProb * (1.0 - pData0->dProb) +
                  Power1 + 2.0 * pData1->dProb * (1.0 - pData1->dProb);
    }
    return Area + 1;
}